

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O3

Matcher<std::basic_string_view<char,_std::char_traits<char>_>_> * __thiscall
testing::internal::ComparisonBase::operator_cast_to_Matcher
          (Matcher<std::basic_string_view<char,_std::char_traits<char>_>_> *__return_storage_ptr__,
          ComparisonBase *this)

{
  MatcherInterface<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *__p;
  
  __p = (MatcherInterface<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *)
        operator_new(0x28);
  (__p->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__Impl_00159c68;
  __p[1].super_MatcherDescriberInterface._vptr_MatcherDescriberInterface = (_func_int **)(__p + 3);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(__p + 1),*(long *)this,*(long *)(this + 8) + *(long *)this);
  (__return_storage_ptr__->super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>
  )._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00159a00;
  (__return_storage_ptr__->super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>
  ).impl_.
  super___shared_ptr<const_testing::MatcherInterface<const_std::basic_string_view<char,_std::char_traits<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<testing::MatcherInterface<std::basic_string_view<char,std::char_traits<char>>const&>const*>
            (&(__return_storage_ptr__->
              super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>).impl_.
              super___shared_ptr<const_testing::MatcherInterface<const_std::basic_string_view<char,_std::char_traits<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,__p);
  (__return_storage_ptr__->super_MatcherBase<std::basic_string_view<char,_std::char_traits<char>_>_>
  )._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_00159748;
  return __return_storage_ptr__;
}

Assistant:

operator Matcher<Lhs>() const {
    return Matcher<Lhs>(new Impl<const Lhs&>(rhs_));
  }